

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

void hydro_random_ratchet(void)

{
  undefined8 in_RAX;
  long *in_FS_OFFSET;
  uint8_t *unaff_retaddr;
  uint8_t tag;
  
  tag = (uint8_t)((ulong)in_RAX >> 0x38);
  mem_zero((void *)(*in_FS_OFFSET + -0x40),0x10);
  store64_le((uint8_t *)(*in_FS_OFFSET + -0x40),*(uint64_t *)(*in_FS_OFFSET + -0x10));
  *(long *)(*in_FS_OFFSET + -0x10) = *(long *)(*in_FS_OFFSET + -0x10) + 1;
  gimli_core_u8(unaff_retaddr,tag);
  *(undefined1 *)(*in_FS_OFFSET + -7) = 0x10;
  return;
}

Assistant:

void
hydro_random_ratchet(void)
{
    mem_zero(hydro_random_context.state, gimli_RATE);
    STORE64_LE(hydro_random_context.state, hydro_random_context.counter);
    hydro_random_context.counter++;
    gimli_core_u8(hydro_random_context.state, 0);
    hydro_random_context.available = gimli_RATE;
}